

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSender.hpp
# Opt level: O0

void __thiscall Statsd::UDPSender::sendToDaemon(UDPSender *this,string *message)

{
  int __fd;
  void *__buf;
  size_t __n;
  int *piVar1;
  __cxx11 local_100 [32];
  __cxx11 local_e0 [32];
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  ssize_t local_20;
  ssize_t ret;
  string *message_local;
  UDPSender *this_local;
  
  __fd = this->m_socket;
  ret = (ssize_t)message;
  message_local = (string *)this;
  __buf = (void *)std::__cxx11::string::data();
  __n = std::__cxx11::string::size();
  local_20 = sendto(__fd,__buf,__n,0,(sockaddr *)&this->m_server,0x10);
  if (local_20 == -1) {
    std::operator+((char *)local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "sendto server failed: host=");
    std::operator+(local_a0,(char *)local_c0);
    std::__cxx11::to_string(local_e0,(uint)this->m_port);
    std::operator+(local_80,local_a0);
    std::operator+(local_60,(char *)local_80);
    piVar1 = __errno_location();
    std::__cxx11::to_string(local_100,*piVar1);
    std::operator+(local_40,local_60);
    std::__cxx11::string::operator=((string *)&this->m_errorMessage,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string(local_c0);
  }
  return;
}

Assistant:

inline void UDPSender::sendToDaemon(const std::string& message) noexcept {
    // Try sending the message
    const auto ret = sendto(m_socket,
                            message.data(),
#ifdef _WIN32
                            static_cast<int>(message.size()),
#else
                            message.size(),
#endif
                            0,
                            (struct sockaddr*)&m_server,
                            sizeof(m_server));
    if (ret == -1) {
        m_errorMessage = "sendto server failed: host=" + m_host + ":" +
                         std::to_string(static_cast<unsigned int>(m_port)) + ", err=" + std::to_string(SOCKET_ERRNO);
    }
}